

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint ensureBits32(LodePNGBitReader *reader,size_t nbits)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar1 = reader->size;
  uVar2 = reader->bp;
  uVar4 = uVar2 >> 3;
  if (uVar4 + 4 < uVar1) {
    bVar3 = (byte)uVar2 & 7;
    uVar5 = *(uint *)(reader->data + uVar4) >> bVar3;
    reader->buffer = uVar5;
    reader->buffer = ((uint)reader->data[uVar4 + 4] << 0x18) << (8 - bVar3 & 0x1f) | uVar5;
    return 1;
  }
  reader->buffer = 0;
  uVar5 = 0;
  if (uVar4 < uVar1) {
    uVar5 = (uint)reader->data[uVar4];
    reader->buffer = (uint)reader->data[uVar4];
  }
  if (uVar4 + 1 < uVar1) {
    uVar5 = uVar5 | (uint)reader->data[uVar4 + 1] << 8;
    reader->buffer = uVar5;
  }
  if (uVar4 + 2 < uVar1) {
    uVar5 = uVar5 | (uint)reader->data[uVar4 + 2] << 0x10;
    reader->buffer = uVar5;
  }
  if (uVar4 + 3 < uVar1) {
    uVar5 = uVar5 | (uint)reader->data[uVar4 + 3] << 0x18;
  }
  reader->buffer = uVar5 >> ((byte)uVar2 & 7);
  return (uint)(nbits + uVar2 <= reader->bitsize);
}

Assistant:

static LODEPNG_INLINE unsigned ensureBits32(LodePNGBitReader* reader, size_t nbits) {
  size_t start = reader->bp >> 3u;
  size_t size = reader->size;
  if(start + 4u < size) {
    reader->buffer = (unsigned)reader->data[start + 0] | ((unsigned)reader->data[start + 1] << 8u) |
                     ((unsigned)reader->data[start + 2] << 16u) | ((unsigned)reader->data[start + 3] << 24u);
    reader->buffer >>= (reader->bp & 7u);
    reader->buffer |= (((unsigned)reader->data[start + 4] << 24u) << (8u - (reader->bp & 7u)));
    return 1;
  } else {
    reader->buffer = 0;
    if(start + 0u < size) reader->buffer |= reader->data[start + 0];
    if(start + 1u < size) reader->buffer |= ((unsigned)reader->data[start + 1] << 8u);
    if(start + 2u < size) reader->buffer |= ((unsigned)reader->data[start + 2] << 16u);
    if(start + 3u < size) reader->buffer |= ((unsigned)reader->data[start + 3] << 24u);
    reader->buffer >>= (reader->bp & 7u);
    return reader->bp + nbits <= reader->bitsize;
  }
}